

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
TasGrid::OneDimensionalNodes::getFejer2Nodes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,int level)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  allocator_type local_49;
  ulong local_48;
  double local_40;
  value_type_conflict2 local_38;
  
  local_38 = 0.0;
  ::std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(ulong)(uint)~(-1 << ((char)level + 1U & 0x1f)),&local_38,
             &local_49);
  if (0 < level) {
    uVar2 = (ulong)(level + 1);
    lVar4 = 1;
    iVar6 = 2;
    local_48 = uVar2;
    do {
      iVar5 = 1 << ((byte)iVar6 & 0x1f);
      if (iVar6 != 0x1f) {
        local_40 = (double)iVar5;
        lVar4 = (long)(int)lVar4;
        iVar3 = iVar5 + -1;
        iVar1 = 1;
        do {
          dVar8 = cos(((double)iVar3 * 3.141592653589793) / local_40);
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar4] = dVar8;
          lVar4 = lVar4 + 1;
          iVar1 = iVar1 + 2;
          iVar3 = iVar3 + -2;
          uVar2 = local_48;
        } while (iVar1 <= iVar5);
      }
      bVar7 = iVar6 != (int)uVar2;
      iVar6 = iVar6 + 1;
    } while (bVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> OneDimensionalNodes::getFejer2Nodes(int level){
    int n = OneDimensionalMeta::getNumPoints(level, rule_fejer2);
    std::vector<double> nodes(n, 0.0);
    if (level > 0){
        int count = 1;
        for(int l=2; l<=level+1; l++){
            n = OneDimensionalMeta::getNumPoints(l, rule_clenshawcurtis);
            for(int i=1; i<n; i+=2){
                nodes[count++] = std::cos(Maths::pi * ((double) (n-i-1)) / ((double) (n - 1)));
            }
        }
    }
    return nodes;
}